

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
          (SmallVectorBase<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference pbVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  void *pvVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  long *plVar13;
  long lVar14;
  long *plVar15;
  reference pbVar16;
  ulong capacity;
  
  plVar15 = (long *)(*(long *)(this + 8) * 0x20 + *(long *)this);
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    if (*(long *)(this + 8) == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = *(long *)(this + 8) + 1;
    uVar6 = *(ulong *)(this + 0x10);
    if (capacity < uVar6 * 2) {
      capacity = uVar6 * 2;
    }
    if (0x7fffffffffffffff - uVar6 < uVar6) {
      capacity = 0x7fffffffffffffff;
    }
    lVar8 = (long)plVar15 - *(long *)this;
    pvVar9 = detail::allocArray(capacity,0x20);
    pbVar2 = (reference)((long)pvVar9 + lVar8);
    puVar3 = (undefined8 *)((long)pvVar9 + lVar8);
    *puVar3 = puVar3 + 2;
    pcVar5 = (args->_M_dataplus)._M_p;
    paVar1 = &args->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 == paVar1) {
      uVar7 = *(undefined8 *)((long)&args->field_2 + 8);
      puVar3[2] = paVar1->_M_allocated_capacity;
      puVar3[3] = uVar7;
    }
    else {
      (pbVar2->_M_dataplus)._M_p = pcVar5;
      (pbVar2->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    pbVar2->_M_string_length = args->_M_string_length;
    (args->_M_dataplus)._M_p = (pointer)paVar1;
    args->_M_string_length = 0;
    (args->field_2)._M_local_buf[0] = '\0';
    plVar11 = *(long **)this;
    lVar12 = *(long *)(this + 8);
    pbVar16 = pbVar2;
    if (plVar11 + lVar12 * 4 == plVar15) {
      if (lVar12 != 0) {
        plVar13 = (long *)((long)pvVar9 + 0x10);
        plVar11 = plVar11 + 2;
        do {
          plVar13[-2] = (long)plVar13;
          if (plVar11 == (long *)plVar11[-2]) {
            lVar8 = plVar11[1];
            *plVar13 = *plVar11;
            plVar13[1] = lVar8;
          }
          else {
            plVar13[-2] = plVar11[-2];
            *plVar13 = *plVar11;
          }
          plVar13[-1] = plVar11[-1];
          plVar11[-2] = (long)plVar11;
          plVar11[-1] = 0;
          *(undefined1 *)plVar11 = 0;
          plVar13 = plVar13 + 4;
          plVar10 = plVar11 + 2;
          plVar11 = plVar11 + 4;
        } while (plVar10 != plVar15);
      }
    }
    else {
      if (plVar11 != plVar15) {
        plVar13 = (long *)((long)pvVar9 + 0x10);
        plVar11 = plVar11 + 2;
        do {
          plVar13[-2] = (long)plVar13;
          if (plVar11 == (long *)plVar11[-2]) {
            lVar12 = plVar11[1];
            *plVar13 = *plVar11;
            plVar13[1] = lVar12;
          }
          else {
            plVar13[-2] = plVar11[-2];
            *plVar13 = *plVar11;
          }
          plVar13[-1] = plVar11[-1];
          plVar11[-2] = (long)plVar11;
          plVar11[-1] = 0;
          *(undefined1 *)plVar11 = 0;
          plVar13 = plVar13 + 4;
          plVar10 = plVar11 + 2;
          plVar11 = plVar11 + 4;
        } while (plVar10 != plVar15);
        plVar11 = *(long **)this;
        lVar12 = *(long *)(this + 8);
      }
      if (plVar11 + lVar12 * 4 != plVar15) {
        lVar14 = 0;
        do {
          puVar3 = (undefined8 *)((long)pvVar9 + lVar14 + lVar8 + 0x30);
          *(undefined8 **)((long)pvVar9 + lVar14 + lVar8 + 0x20) = puVar3;
          puVar4 = (undefined8 *)((long)plVar15 + lVar14);
          pbVar16 = (reference)(puVar4 + 2);
          if (pbVar16 == (reference)*puVar4) {
            uVar7 = puVar4[3];
            *puVar3 = (pbVar16->_M_dataplus)._M_p;
            puVar3[1] = uVar7;
          }
          else {
            *(reference *)((long)pvVar9 + lVar14 + lVar8 + 0x20) = (reference)*puVar4;
            *(pointer *)((long)pvVar9 + lVar14 + lVar8 + 0x30) = (pbVar16->_M_dataplus)._M_p;
          }
          puVar3 = (undefined8 *)((long)plVar15 + lVar14);
          *(undefined8 *)((long)pvVar9 + lVar14 + lVar8 + 0x28) = puVar3[1];
          *puVar3 = pbVar16;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          lVar14 = lVar14 + 0x20;
        } while (puVar3 + 4 != plVar11 + lVar12 * 4);
      }
    }
    SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,(EVP_PKEY_CTX *)pbVar16);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = capacity;
    *(void **)this = pvVar9;
    return pbVar2;
  }
  *plVar15 = (long)(plVar15 + 2);
  pcVar5 = (args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    lVar8 = *(long *)((long)&args->field_2 + 8);
    plVar15[2] = paVar1->_M_allocated_capacity;
    plVar15[3] = lVar8;
  }
  else {
    *plVar15 = (long)pcVar5;
    plVar15[2] = paVar1->_M_allocated_capacity;
  }
  plVar15[1] = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  lVar8 = *(long *)(this + 8) + 1;
  *(long *)(this + 8) = lVar8;
  if (lVar8 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<std::basic_string<char>>::back() [T = std::basic_string<char>]"
              );
  }
  return (reference)(lVar8 * 0x20 + *(long *)this + -0x20);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }